

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O2

void __thiscall CDT::compile(CDT *this,uint n_layer)

{
  pointer pLVar1;
  uint uVar2;
  
  std::vector<Layer,_std::allocator<Layer>_>::resize(&this->m_layers,(ulong)n_layer);
  Layer::add_perceptron
            ((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start,(this->m_input).m_shape.n_col - 1);
  uVar2 = 1;
  while( true ) {
    pLVar1 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pLVar1) / 0x130 - 1U <= (ulong)(uVar2 - 1))
    break;
    Layer::compile(pLVar1 + (uVar2 - 1),pLVar1[uVar2].m_shape.n_col);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void CDT::compile(unsigned n_layer){
    m_layers.resize(n_layer);
    
    m_layers[0].add_perceptron(m_input.shape().n_col-1);
    for(unsigned i=0;i<m_layers.size()-1;++i){
        m_layers[i].compile(m_layers[i+1].m_shape.n_col);
    }
}